

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTextWidget::selection(QAccessibleTextWidget *this)

{
  int *in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_0000001c;
  QAccessibleTextWidget *in_stack_00000020;
  
  selection(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void QAccessibleTextWidget::selection(int selectionIndex, int *startOffset, int *endOffset) const
{
    *startOffset = *endOffset = 0;
    QTextCursor cursor = textCursor();

    if (selectionIndex != 0 || !cursor.hasSelection())
        return;

    *startOffset = cursor.selectionStart();
    *endOffset = cursor.selectionEnd();
}